

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O3

Table * __thiscall
wasm::Module::addTable
          (Module *this,unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *curr)

{
  Table *pTVar1;
  string local_40;
  _Head_base<0UL,_wasm::Table_*,_false> local_20;
  
  local_20._M_head_impl =
       (curr->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
       super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
       super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
  (curr->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
  super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl = (Table *)0x0;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"addTable","");
  pTVar1 = addModuleElement<std::vector<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>,std::allocator<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>>>,std::unordered_map<wasm::Name,wasm::Table*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Table*>>>,wasm::Table>
                     (&this->tables,&this->tablesMap,
                      (unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)&local_20,
                      &local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (local_20._M_head_impl != (Table *)0x0) {
    operator_delete(local_20._M_head_impl,0x50);
  }
  return pTVar1;
}

Assistant:

Table* Module::addTable(std::unique_ptr<Table>&& curr) {
  return addModuleElement(tables, tablesMap, std::move(curr), "addTable");
}